

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O3

int __thiscall
event_track::gen_avail_files
          (event_track *this,uint32_t track_duration,uint32_t seg_duration_ticks_ms,
          uint32_t avail_duration,uint32_t avail_interval,uint64_t start_time)

{
  uchar *puVar1;
  char cVar2;
  int iVar3;
  ulong pt_off_end;
  ostream *poVar4;
  undefined4 in_register_00000084;
  ulong pt_off_start;
  ulong uVar5;
  pointer pDVar6;
  uint32_t uVar7;
  char local_2e1;
  string base64_mes;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  events;
  string out_file_cmfm;
  string out_file_mpd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dec;
  ofstream ot;
  uint32_t local_228 [2];
  _func_int *local_220;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [2];
  pointer local_1e8;
  undefined3 uStack_1e0;
  undefined5 uStack_1dd;
  undefined3 uStack_1d8;
  undefined5 uStack_1d5;
  undefined3 uStack_1d0;
  undefined8 local_1cc;
  undefined4 local_1c4;
  ulong local_1c0;
  uint32_t local_1b8;
  uint32_t local_1b4;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170 [2];
  ios_base local_138 [264];
  
  pt_off_start = CONCAT44(in_register_00000084,avail_interval);
  events.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  events.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  events.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out_file_cmfm._M_dataplus._M_p = (pointer)&out_file_cmfm.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out_file_cmfm,"out_avail_track.cmfm","");
  out_file_mpd._M_dataplus._M_p = (pointer)&out_file_mpd.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out_file_mpd,"out_avail_track.mpd","");
  pt_off_end = ((ulong)this & 0xffffffff) + pt_off_start;
  if (pt_off_start < pt_off_end) {
    uVar7 = 0;
    uVar5 = pt_off_start;
    do {
      local_228[0] = 0;
      local_220 = (_func_int *)0x0;
      local_210 = 0;
      local_208[0]._M_local_buf[0] = '\0';
      local_1cc._0_4_ = 0;
      local_1cc._4_4_ = 0;
      uStack_1d8 = 0;
      uStack_1d5 = 0;
      uStack_1d0._0_1_ = false;
      uStack_1d0._1_1_ = false;
      uStack_1d0._2_1_ = 0;
      local_1e8 = (pointer)0x0;
      uStack_1e0 = 0;
      uStack_1dd = 0;
      _ot = &PTR_size_00121a88;
      local_1b0._M_p = (pointer)&local_1a0;
      local_1a8 = 0;
      local_1a0._M_local_buf[0] = '\0';
      local_190._M_p = (pointer)&local_180;
      local_188 = 0;
      local_180._M_local_buf[0] = '\0';
      local_170[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_170[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c4 = 1000;
      local_218._M_p = (pointer)local_208;
      local_1c0 = uVar5;
      local_1b8 = seg_duration_ticks_ms;
      local_1b4 = uVar7;
      std::__cxx11::string::_M_replace((ulong)&local_1b0,0,(char *)0x0,0x11a048);
      fmp4_stream::gen_splice_insert(local_170,local_1b4,local_1b8 * 0x5a,false);
      std::
      vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ::push_back(&events,(value_type *)&ot);
      _ot = &PTR_size_00121a88;
      if (local_170[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170[0].
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_170[0].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170[0].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p,
                        CONCAT71(local_180._M_allocated_capacity._1_7_,local_180._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p != &local_1a0) {
        operator_delete(local_1b0._M_p,
                        CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0]) +
                        1);
      }
      _ot = &PTR_size_00121ad0;
      if (local_1e8 != (pointer)0x0) {
        operator_delete(local_1e8,CONCAT53(uStack_1d5,uStack_1d8) - (long)local_1e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_p != local_208) {
        operator_delete(local_218._M_p,
                        CONCAT71(local_208[0]._M_allocated_capacity._1_7_,
                                 local_208[0]._M_local_buf[0]) + 1);
      }
      uVar5 = uVar5 + avail_duration;
      uVar7 = uVar7 + 1;
    } while (uVar5 < pt_off_end);
  }
  _ot = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ot,"test_urn","");
  write_to_segmented_event_track_file
            (&out_file_cmfm,&events,99,pt_off_start,pt_off_end,(string *)start_time,
             (ulong)track_duration,1000);
  if ((_func_int **)_ot != &local_220) {
    operator_delete(_ot,(ulong)(local_220 + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"wrote event track ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generating the MPD",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::ofstream::ofstream(&ot,"out_avail_track.mpd",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,"<EventStream ",0xd);
  std::ios::widen((char)(ostream *)&ot + (char)((_func_int **)_ot)[-3]);
  std::ostream::put((char)&ot);
  std::ostream::flush();
  iVar3 = std::__cxx11::string::compare
                    ((char *)&(events.
                               super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                               ._M_impl.super__Vector_impl_data._M_start)->scheme_id_uri_);
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,"schemeIdUri=",0xc);
    base64_mes._M_dataplus._M_p._0_1_ = 0x22;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&ot,(char *)&base64_mes,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"urn:scte:scte35:2014:xml+bin",0x1c);
    base64_mes._M_dataplus._M_p._0_1_ = 0x22;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,"schemeIdUri=",0xc);
    base64_mes._M_dataplus._M_p._0_1_ = 0x22;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&ot,(char *)&base64_mes,1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,((events.
                                 super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->scheme_id_uri_).
                               _M_dataplus._M_p,
                        ((events.
                          super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                          ._M_impl.super__Vector_impl_data._M_start)->scheme_id_uri_).
                        _M_string_length);
    base64_mes._M_dataplus._M_p._0_1_ = 0x22;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot," timescale=",0xb);
  base64_mes._M_dataplus._M_p._0_1_ = 0x22;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,(char *)&base64_mes,1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  base64_mes._M_dataplus._M_p._0_1_ = 0x22;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (events.
      super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      events.
      super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pDVar6 = events.
             super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," writing an event to output ",0x1c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,"<Event ",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,"presentationTime=",0x11);
      base64_mes._M_dataplus._M_p._0_1_ = 0x22;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&ot,(char *)&base64_mes,1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      base64_mes._M_dataplus._M_p._0_1_ = 0x22;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"duration=",9);
      base64_mes._M_dataplus._M_p._0_1_ = 0x22;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      base64_mes._M_dataplus._M_p._0_1_ = 0x22;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"id=",3);
      base64_mes._M_dataplus._M_p._0_1_ = 0x22;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      base64_mes._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
      iVar3 = std::__cxx11::string::compare((char *)&pDVar6->scheme_id_uri_);
      if (iVar3 == 0) {
        puVar1 = (pDVar6->message_data_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        base64_encode_abi_cxx11_
                  (&base64_mes,puVar1,
                   (ulong)(uint)(*(int *)&(pDVar6->message_data_).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1))
        ;
        base64_decode(&dec,&base64_mes);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"base64 of cue: ",0xf);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)CONCAT71(base64_mes._M_dataplus._M_p._1_7_,
                                             base64_mes._M_dataplus._M_p._0_1_),
                            base64_mes._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        local_2e1 = '>';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,&local_2e1,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        poVar4 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  <Signal xmlns=",0x10);
        local_2e1 = '\"';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_2e1,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"http://www.scte.org/schemas/35/2016",0x23);
        local_2e1 = '\"';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_2e1,1);
        local_2e1 = '>';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_2e1,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        poVar4 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    <Binary>",0xc);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)CONCAT71(base64_mes._M_dataplus._M_p._1_7_,
                                                    base64_mes._M_dataplus._M_p._0_1_),
                            base64_mes._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</Binary>",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        poVar4 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  </Signal>",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (dec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(dec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)dec.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)dec.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,"contentEncoding=",0x10);
        base64_mes._M_dataplus._M_p._0_1_ = 0x22;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&ot,(char *)&base64_mes,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"base64",6);
        base64_mes._M_dataplus._M_p._0_1_ = 0x22;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
        base64_mes._M_dataplus._M_p._0_1_ = 0x3e;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&base64_mes,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        poVar4 = (ostream *)std::ostream::flush();
        puVar1 = (pDVar6->message_data_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        base64_encode_abi_cxx11_
                  (&base64_mes,puVar1,
                   (ulong)(uint)(*(int *)&(pDVar6->message_data_).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1))
        ;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)CONCAT71(base64_mes._M_dataplus._M_p._1_7_,
                                                    base64_mes._M_dataplus._M_p._0_1_),
                            base64_mes._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(base64_mes._M_dataplus._M_p._1_7_,base64_mes._M_dataplus._M_p._0_1_) !=
          &base64_mes.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(base64_mes._M_dataplus._M_p._1_7_,base64_mes._M_dataplus._M_p._0_1_
                                ),base64_mes.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,"</Event>",8);
      cVar2 = (char)(ostream *)&ot;
      std::ios::widen((char)((_func_int **)_ot)[-3] + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      pDVar6 = pDVar6 + 1;
    } while (pDVar6 != events.
                       super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ot,"</EventStream> ",0xf);
  std::ios::widen((char)(ostream *)&ot + (char)((_func_int **)_ot)[-3]);
  std::ostream::put((char)&ot);
  std::ostream::flush();
  std::ofstream::close();
  _ot = _VTT;
  *(undefined8 *)(&ot + (long)_VTT[-3]) = ___gmon_start__;
  std::filebuf::~filebuf((filebuf *)local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_file_mpd._M_dataplus._M_p != &out_file_mpd.field_2) {
    operator_delete(out_file_mpd._M_dataplus._M_p,out_file_mpd.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_file_cmfm._M_dataplus._M_p != &out_file_cmfm.field_2) {
    operator_delete(out_file_cmfm._M_dataplus._M_p,out_file_cmfm.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>::
  ~vector(&events);
  return 0;
}

Assistant:

int event_track::gen_avail_files(uint32_t track_duration, 
	uint32_t seg_duration_ticks_ms, 
	uint32_t avail_duration, 
	uint32_t avail_interval, 
	uint64_t start_time)
{
	std::vector<event_track::DASHEventMessageBoxv1> events;

	std::string out_file_cmfm = "out_avail_track.cmfm";
	std::string out_file_mpd = "out_avail_track.mpd";

	uint32_t timescale = 1000;
	uint32_t track_id = 99; // default track_id

	uint32_t id_count = 0;

	uint64_t track_duration_2 = start_time + track_duration;
	uint64_t st_2 = start_time;

	while (st_2 < track_duration_2)
	{
		event_track::DASHEventMessageBoxv1 ev;
		ev.id_ = id_count++;
		ev.presentation_time_ = st_2;
		ev.event_duration_ = avail_duration;
		ev.timescale_ = timescale;
		ev.scheme_id_uri_ = "urn:scte:scte35:2013:bin";
		fmp4_stream::gen_splice_insert(ev.message_data_, ev.id_, ev.event_duration_ * 90, false);
		st_2 += avail_interval;
		events.push_back(ev);
	}

	event_track::write_to_segmented_event_track_file(
		out_file_cmfm, events,
		track_id, start_time,
		track_duration + start_time, "test_urn",
		seg_duration_ticks_ms, timescale);

	std::cout << "wrote event track " << std::endl;


	std::cout << "generating the MPD" << std::endl;
	std::ofstream ot = std::ofstream("out_avail_track.mpd");
	ot << "<EventStream " << std::endl;
	if (events[0].scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // convert binary scte 214 to xml + bin
	{
		ot << "schemeIdUri=" << '"' << "urn:scte:scte35:2014:xml+bin" << '"' << std::endl;
	}
	else {
		ot << "schemeIdUri=" << '"' << events[0].scheme_id_uri_ << '"' << std::endl;
	}
	ot << " timescale=" << '"' << timescale << '"' << ">" << std::endl;

	// write each of the event messages as moof mdat combinations in sparse track 
	for (auto it2 = events.begin(); it2 != events.end(); it2++)
	{
		std::cout << " writing an event to output " << std::endl;
		ot << "<Event "
			<< "presentationTime=" << '"' << it2->presentation_time_ << '"' << " "  \
			<< "duration=" << '"' << it2->event_duration_ << '"' << " "  \
			<< "id=" << '"' << it2->id_ << '"';
		if (it2->scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
		{ 
			
			std::string base64_mes = base64_encode(it2->message_data_.data(), (unsigned int)it2->message_data_.size());
			std::vector<uint8_t> dec = base64_decode(base64_mes);
			std::cout << "base64 of cue: " << base64_mes << std::endl;
			ot << '>' << std::endl << "  <Signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
				<< "    <Binary>" << base64_mes << "</Binary>" << std::endl
				<< "  </Signal>" << std::endl;
		}
		else {
			ot << " " << "contentEncoding=" << '"' << "base64" << '"' << '>' << std::endl
				<< base64_encode(it2->message_data_.data(), (unsigned int)it2->message_data_.size()) << std::endl;
		}
		ot << "</Event>" << std::endl;
	}

	ot << "</EventStream> " << std::endl;
	ot.close();

	return 0;
}